

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O3

double __thiscall
anon_unknown.dwarf_1f808::sampleY<float>
          (anon_unknown_dwarf_1f808 *this,TypedImageChannel<float> *channel,int h,int x,double y,
          Extrapolation ext)

{
  uint x_00;
  float fVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  
  if (0.0 <= y) {
    uVar7 = (uint)y;
  }
  else {
    dVar9 = -y;
    uVar7 = -((uint)((double)(int)dVar9 < dVar9) + (int)dVar9);
  }
  x_00 = uVar7 + 1;
  uVar4 = (ulong)x_00;
  switch(ext) {
  case BLACK:
    dVar10 = 0.0;
    dVar9 = 0.0;
    if ((int)uVar7 < h && -1 < (int)uVar7) {
      dVar9 = (double)*(float *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                                (long)x * 4 + (ulong)uVar7 * (long)this * 4);
    }
    if (h <= (int)x_00 || (int)uVar7 < -1) goto LAB_00109fb3;
    goto LAB_00109fa8;
  case CLAMP:
    uVar6 = h - 1;
    uVar8 = uVar6;
    if ((int)uVar7 < (int)uVar6) {
      uVar8 = uVar7;
    }
    if ((int)uVar7 < 0) {
      uVar8 = 0;
    }
    if ((int)x_00 < (int)uVar6) {
      uVar6 = x_00;
    }
    if ((int)uVar7 < -1) {
      uVar6 = 0;
    }
    fVar1 = *(float *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                      (long)x * 4 + (long)(int)uVar8 * (long)this * 4);
    break;
  case PERIODIC:
    if ((int)uVar7 < 0) {
      if (-1 < h) {
        uVar8 = ((~uVar7 + h) - (~uVar7 + h) % (uint)h) + uVar7;
        if (uVar7 != 0xffffffff) {
          uVar7 = ((h - uVar7) - 2) / (uint)h;
          goto LAB_00109f7d;
        }
        goto LAB_00109e93;
      }
      uVar8 = uVar7 - ((~h - uVar7) / (uint)-h) * h;
      if (uVar7 == 0xffffffff) goto LAB_00109f76;
      uVar7 = (~h - x_00) / (uint)-h;
    }
    else if (h < 0) {
      uVar8 = uVar7 + (uVar7 / (uint)-h) * h;
LAB_00109f76:
      uVar7 = x_00 / (uint)-h;
LAB_00109f7d:
      uVar7 = -uVar7;
    }
    else {
      uVar8 = uVar7 % (uint)h;
LAB_00109e93:
      uVar7 = x_00 / (uint)h;
    }
    uVar6 = x_00 - uVar7 * h;
    fVar1 = *(float *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                      (long)x * 4 + (long)(int)uVar8 * (long)this * 4);
    break;
  case MIRROR:
    iVar2 = mirror(uVar7,h);
    iVar3 = mirror(x_00,h);
    dVar9 = (double)*(float *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                              (long)x * 4 + (long)iVar2 * (long)this * 4);
    pfVar5 = (float *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                      (long)x * 4 + (long)iVar3 * (long)this * 4);
    goto LAB_00109fac;
  default:
    dVar9 = 0.0;
    dVar10 = 0.0;
    goto LAB_00109fb3;
  }
  dVar9 = (double)fVar1;
  uVar4 = (ulong)(int)uVar6;
LAB_00109fa8:
  pfVar5 = (float *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                    (long)x * 4 + uVar4 * (long)this * 4);
LAB_00109fac:
  dVar10 = (double)*pfVar5;
LAB_00109fb3:
  return ((double)(int)x_00 - y) * dVar9 + (1.0 - ((double)(int)x_00 - y)) * dVar10;
}

Assistant:

double
sampleY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is an integer, and y is a floating point number.
    //

    int    ys = IMATH_NAMESPACE::floor (y);
    int    yt = ys + 1;
    double s  = yt - y;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (ys >= 0 && ys < h) ? double (channel (x, ys)) : 0.0;
            vt = (yt >= 0 && yt < h) ? double (channel (x, yt)) : 0.0;
            break;

        case CLAMP:

            ys = IMATH_NAMESPACE::clamp (ys, 0, h - 1);
            yt = IMATH_NAMESPACE::clamp (yt, 0, h - 1);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case PERIODIC:

            ys = modp (ys, h);
            yt = modp (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case MIRROR:

            ys = mirror (ys, h);
            yt = mirror (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;
    }

    return s * vs + t * vt;
}